

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void __thiscall helics::FedObject::~FedObject(FedObject *this)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  MessageHolder *unaff_retaddr;
  shared_ptr<helics::Federate> *in_stack_ffffffffffffffd8;
  vector<std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>,_std::allocator<std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>_>_>
  *in_stack_fffffffffffffff0;
  
  MessageHolder::clear(unaff_retaddr);
  std::
  vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
  ::clear((vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
           *)0x1a216c);
  std::
  vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
  ::clear((vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
           *)0x1a217a);
  std::
  vector<std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>,_std::allocator<std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>_>_>
  ::clear((vector<std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>,_std::allocator<std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>_>_>
           *)0x1a218b);
  std::
  vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
  ::clear((vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
           *)0x1a219c);
  std::shared_ptr<helics::Federate>::shared_ptr
            ((shared_ptr<helics::Federate> *)in_RDI,in_stack_ffffffffffffffd8);
  std::shared_ptr<helics::Federate>::operator=
            ((shared_ptr<helics::Federate> *)in_RDI,in_stack_ffffffffffffffd8);
  std::shared_ptr<helics::Federate>::~shared_ptr((shared_ptr<helics::Federate> *)0x1a21c7);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(in_RDI);
  std::
  vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
  ::~vector((vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
             *)in_stack_fffffffffffffff0);
  std::
  vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
  ::~vector((vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
             *)in_stack_fffffffffffffff0);
  std::
  vector<std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>,_std::allocator<std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>_>_>
  ::~vector(in_stack_fffffffffffffff0);
  std::
  vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
  ::~vector((vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
             *)in_stack_fffffffffffffff0);
  std::
  vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
  ::~vector((vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
             *)in_stack_fffffffffffffff0);
  MessageHolder::~MessageHolder((MessageHolder *)in_RDI);
  std::shared_ptr<helics::Federate>::~shared_ptr((shared_ptr<helics::Federate> *)0x1a2243);
  return;
}

Assistant:

helics::FedObject::~FedObject()
{
    // we want to remove the values in the arrays before deleting the fedptr
    // and we want to do it inside this function to ensure it does so in a consistent manner
    messages.clear();
    inputs.clear();
    pubs.clear();
    epts.clear();
    filters.clear();
    fedptr = nullptr;
}